

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCompute
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  int iVar1;
  allocator<char> local_41;
  Value local_40;
  
  if ((int)this->m_State < 3) {
    if (this->m_State == STATE_CONFIGURED) {
      iVar1 = cmake::Generate((this->super_cmServerProtocol).m_CMakeInstance._M_t.
                              super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                              super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                              super__Head_base<0UL,_cmake_*,_false>._M_head_impl);
      if (-1 < iVar1) {
        this->m_State = STATE_COMPUTED;
        Json::Value::Value(&local_40,nullValue);
        cmServerRequest::Reply(__return_storage_ptr__,request,&local_40);
        Json::Value::~Value(&local_40);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Failed to compute build system.",&local_41);
      cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_40);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"This project was not configured yet.",&local_41);
      cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_40);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"This build system was already generated.",&local_41);
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCompute(
  const cmServerRequest& request)
{
  if (this->m_State > STATE_CONFIGURED) {
    return request.ReportError("This build system was already generated.");
  }
  if (this->m_State < STATE_CONFIGURED) {
    return request.ReportError("This project was not configured yet.");
  }

  cmake* cm = this->CMakeInstance();
  int ret = cm->Generate();

  if (ret < 0) {
    return request.ReportError("Failed to compute build system.");
  }
  m_State = STATE_COMPUTED;
  return request.Reply(Json::Value());
}